

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O3

int fits_make_histd(fitsfile *fptr,fitsfile *histptr,int bitpix,int naxis,long *naxes,int *colnum,
                   double *amin,double *amax,double *binsize,double weight,int wtcolnum,int recip,
                   char *selectrow,int *status)

{
  int iVar1;
  
  iVar1 = fits_make_histde(fptr,histptr,(int *)0x0,bitpix,naxis,naxes,colnum,(char **)0x0,amin,amax,
                           binsize,weight,wtcolnum,(char *)0x0,recip,selectrow,status);
  return iVar1;
}

Assistant:

int fits_make_histd(fitsfile *fptr, /* IO - pointer to table with X and Y cols; */
    fitsfile *histptr, /* I - pointer to output FITS image      */
    int bitpix,       /* I - datatype for image: 16, 32, -32, etc    */
    int naxis,        /* I - number of axes in the histogram image   */
    long *naxes,      /* I - size of axes in the histogram image   */
    int *colnum,    /* I - column numbers (array length = naxis)   */
    double *amin,     /* I - minimum histogram value, for each axis */
    double *amax,     /* I - maximum histogram value, for each axis */
    double *binsize, /* I - bin size along each axis               */
    double weight,        /* I - binning weighting factor          */
    int wtcolnum, /* I - optional keyword or col for weight*/
    int recip,              /* I - use reciprocal of the weight?     */
    char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
    int *status)
{		  
  return fits_make_histde(fptr, histptr, 0, bitpix, naxis, naxes,
			  colnum, 0, 
			  amin, amax, binsize, 
			  weight, wtcolnum, 0, recip,
			  selectrow, status);
}